

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O0

void Handler_duration_I_Inventory
               (AInventory *defaults,PClassActor *info,Baggage *bag,FPropParam *params)

{
  bool bVar1;
  int local_38;
  PClass **ppPStack_30;
  int i;
  int *pEffectTics;
  FPropParam *params_local;
  Baggage *bag_local;
  PClassActor *info_local;
  AInventory *defaults_local;
  
  bVar1 = PClass::IsDescendantOf(&info->super_PClass,APowerup::RegistrationInfo.MyClass);
  if (bVar1) {
    ppPStack_30 = (PClass **)&defaults->field_0x4fc;
  }
  else {
    bVar1 = PClass::IsDescendantOf(&info->super_PClass,APowerupGiver::RegistrationInfo.MyClass);
    if (!bVar1) {
      I_Error("\"powerup.duration\" requires an actor of type \"Powerup\"\n");
      return;
    }
    ppPStack_30 = &defaults[1].super_AActor.super_DThinker.super_DObject.Class;
  }
  local_38 = params[1].i;
  if (local_38 < 0) {
    local_38 = local_38 * -0x23;
  }
  *(int *)ppPStack_30 = local_38;
  return;
}

Assistant:

DEFINE_CLASS_PROPERTY_PREFIX(powerup, duration, I, Inventory)
{
	int *pEffectTics;

	if (info->IsDescendantOf(RUNTIME_CLASS(APowerup)))
	{
		pEffectTics = &((APowerup*)defaults)->EffectTics;
	}
	else if (info->IsDescendantOf(RUNTIME_CLASS(APowerupGiver)))
	{
		pEffectTics = &((APowerupGiver*)defaults)->EffectTics;
	}
	else
	{
		I_Error("\"powerup.duration\" requires an actor of type \"Powerup\"\n");
		return;
	}

	PROP_INT_PARM(i, 0);
	*pEffectTics = (i >= 0) ? i : -i * TICRATE;
}